

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioDiagDialog.cpp
# Opt level: O3

void __thiscall
AudioDiagDialog::AudioDiagDialog(AudioDiagDialog *this,Renderer *renderer,QWidget *parent)

{
  QFormLayout *this_00;
  QHBoxLayout *this_01;
  Renderer *pRVar1;
  undefined4 *puVar2;
  QString local_e8;
  QSpinBox *local_d0;
  QLayout *local_c8;
  QPushButton *local_c0;
  QCheckBox *local_b8;
  QProgressBar *local_b0;
  code *local_a8;
  ImplFn local_a0;
  QPushButton *local_98;
  QPushButton *local_90;
  QLayout *local_88;
  QLabel *local_80;
  QLabel *local_78;
  QLabel *local_70;
  QLabel *local_68;
  QLabel *local_60;
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  QObject local_38 [8];
  
  QDialog::QDialog(&this->super_QDialog,parent,0x8003000);
  *(undefined ***)this = &PTR_metaObject_001fb1c0;
  *(undefined ***)&this->field_0x10 = &PTR__AudioDiagDialog_001fb398;
  this->mRenderer = renderer;
  this->mTimerId = -1;
  this->mLastIsRunning = true;
  local_c8 = (QLayout *)&this->mLayout;
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)local_c8);
  QMetaObject::tr((char *)&local_e8,(char *)&staticMetaObject,0x1b50ca);
  local_88 = (QLayout *)&this->mRenderGroup;
  QGroupBox::QGroupBox((QGroupBox *)local_88,&local_e8,(QWidget *)0x0);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
    }
  }
  this_00 = &this->mRenderLayout;
  QFormLayout::QFormLayout(this_00,(QWidget *)0x0);
  QLabel::QLabel(&this->mUnderrunLabel,0,0);
  local_b0 = &this->mBufferProgress;
  local_60 = &this->mUnderrunLabel;
  QProgressBar::QProgressBar(local_b0,(QWidget *)0x0);
  QLabel::QLabel(&this->mStatusLabel,0,0);
  local_68 = &this->mStatusLabel;
  QLabel::QLabel(&this->mElapsedLabel,0,0);
  local_78 = &this->mPeriodLabel;
  local_70 = &this->mElapsedLabel;
  QLabel::QLabel(local_78,0,0);
  local_80 = &this->mPeriodWrittenLabel;
  QLabel::QLabel(local_80,0,0);
  QMetaObject::tr((char *)&local_e8,(char *)&staticMetaObject,0x1b3c7d);
  local_90 = &this->mClearButton;
  QPushButton::QPushButton(local_90,&local_e8,(QWidget *)0x0);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
    }
  }
  this_01 = &this->mButtonLayout;
  QHBoxLayout::QHBoxLayout(this_01);
  QMetaObject::tr((char *)&local_e8,(char *)&staticMetaObject,0x1b50dc);
  local_b8 = &this->mAutoRefreshCheck;
  QCheckBox::QCheckBox(local_b8,&local_e8,(QWidget *)0x0);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
    }
  }
  local_d0 = &this->mIntervalSpin;
  QSpinBox::QSpinBox(local_d0,(QWidget *)0x0);
  QMetaObject::tr((char *)&local_e8,(char *)&staticMetaObject,0x1b50e9);
  local_98 = &this->mRefreshButton;
  QPushButton::QPushButton(local_98,&local_e8,(QWidget *)0x0);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
    }
  }
  QMetaObject::tr((char *)&local_e8,(char *)&staticMetaObject,0x1b50f1);
  local_c0 = &this->mCloseButton;
  QPushButton::QPushButton(local_c0,&local_e8,(QWidget *)0x0);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
    }
  }
  QMetaObject::tr((char *)&local_e8,(char *)&staticMetaObject,0x1b50f7);
  QFormLayout::addRow((QString *)this_00,(QWidget *)&local_e8);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
    }
  }
  QMetaObject::tr((char *)&local_e8,(char *)&staticMetaObject,0x1b5101);
  QFormLayout::addRow((QString *)this_00,(QWidget *)&local_e8);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
    }
  }
  QMetaObject::tr((char *)&local_e8,(char *)&staticMetaObject,0x1b510e);
  QFormLayout::addRow((QString *)this_00,(QWidget *)&local_e8);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
    }
  }
  QMetaObject::tr((char *)&local_e8,(char *)&staticMetaObject,0x1b5115);
  QFormLayout::addRow((QString *)this_00,(QWidget *)&local_e8);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
    }
  }
  QMetaObject::tr((char *)&local_e8,(char *)&staticMetaObject,0x1b511d);
  QFormLayout::addRow((QString *)this_00,(QWidget *)&local_e8);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
    }
  }
  QMetaObject::tr((char *)&local_e8,(char *)&staticMetaObject,0x1b512a);
  QFormLayout::addRow((QString *)this_00,(QWidget *)&local_e8);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
    }
  }
  QFormLayout::setWidget((int)this_00,6,(QWidget *)0x0);
  QWidget::setLayout(local_88);
  QBoxLayout::addWidget(this_01,local_b8,0,0);
  QBoxLayout::addWidget(this_01,local_d0,0,0);
  QBoxLayout::addWidget(this_01,local_98,0,0);
  QBoxLayout::addStretch((int)this_01);
  QBoxLayout::addWidget(this_01,local_c0,0,0);
  QBoxLayout::addWidget(local_c8,local_88,1,0);
  QBoxLayout::addLayout(local_c8,(int)this_01);
  QLayout::setSizeConstraint((SizeConstraint)local_c8);
  QWidget::setLayout((QLayout *)this);
  QMetaObject::tr((char *)&local_e8,(char *)&staticMetaObject,0x1b5164);
  QSpinBox::setSuffix((QString *)local_d0);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
    }
  }
  QSpinBox::setRange((int)local_d0,10);
  QSpinBox::setValue((int)local_d0);
  QCheckBox::setCheckState((CheckState)local_b8);
  QProgressBar::setAlignment(local_b0,0x84);
  QMetaObject::tr((char *)&local_e8,(char *)&staticMetaObject,0x1b513a);
  QProgressBar::setFormat((QString *)local_b0);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
    }
  }
  QPushButton::setDefault(SUB81(local_c0,0));
  setElapsed(this,0);
  setRunningLabel(this,false);
  QMetaObject::tr((char *)&local_e8,(char *)&staticMetaObject,0x1b5150);
  QWidget::setWindowTitle((QString *)this);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
    }
  }
  local_e8.d.d = (Data *)QAbstractButton::clicked;
  local_e8.d.ptr = (char16_t *)0x0;
  local_a8 = QWidget::close;
  local_a0 = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QSlotObject<bool_(QWidget::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar2 + 4) = QWidget::close;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_38,(void **)local_c0,(QObject *)&local_e8,(void **)this,
             (QSlotObjectBase *)&local_a8,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  local_e8.d.d = (Data *)QAbstractButton::clicked;
  local_e8.d.ptr = (char16_t *)0x0;
  local_a8 = refresh;
  local_a0 = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QSlotObject<void_(AudioDiagDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar2 + 4) = refresh;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_40,(void **)local_98,(QObject *)&local_e8,(void **)this,
             (QSlotObjectBase *)&local_a8,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  pRVar1 = this->mRenderer;
  local_e8.d.d = (Data *)QAbstractButton::clicked;
  local_e8.d.ptr = (char16_t *)0x0;
  local_a8 = Renderer::clearDiagnostics;
  local_a0 = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QSlotObject<void_(Renderer::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar2 + 4) = Renderer::clearDiagnostics;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)local_90,(QObject *)&local_e8,(void **)pRVar1,
             (QSlotObjectBase *)&local_a8,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  local_e8.d.d = (Data *)QCheckBox::stateChanged;
  local_e8.d.ptr = (char16_t *)0x0;
  puVar2 = (undefined4 *)operator_new(0x18);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/forms/AudioDiagDialog.cpp:73:9),_1,_QtPrivate::List<int>,_void>
       ::impl;
  *(AudioDiagDialog **)(puVar2 + 4) = this;
  QObject::connectImpl
            (local_50,(void **)local_b8,(QObject *)&local_e8,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  local_e8.d.d = (Data *)QSpinBox::valueChanged;
  local_e8.d.ptr = (char16_t *)0x0;
  puVar2 = (undefined4 *)operator_new(0x18);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/forms/AudioDiagDialog.cpp:83:9),_1,_QtPrivate::List<int>,_void>
       ::impl;
  *(AudioDiagDialog **)(puVar2 + 4) = this;
  QObject::connectImpl
            (local_58,(void **)local_d0,(QObject *)&local_e8,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  return;
}

Assistant:

AudioDiagDialog::AudioDiagDialog(Renderer &renderer, QWidget *parent) :
    QDialog(parent, Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint),
    mRenderer(renderer),
    mTimerId(-1),
    mLastIsRunning(true),
    mLayout(),
    mRenderGroup(tr("Render statistics")),
    mRenderLayout(),
    mUnderrunLabel(),
    mBufferProgress(),
    mStatusLabel(),
    mElapsedLabel(),
    mPeriodLabel(),
    mPeriodWrittenLabel(),
    mClearButton(tr("Clear")),
    mButtonLayout(),
    mAutoRefreshCheck(tr("Auto refresh")),
    mIntervalSpin(),
    mRefreshButton(tr("Refresh")),
    mCloseButton(tr("Close"))
{
    mRenderLayout.addRow(tr("Underruns"), &mUnderrunLabel);
    mRenderLayout.addRow(tr("Buffer usage"), &mBufferProgress);
    mRenderLayout.addRow(tr("Status"), &mStatusLabel);
    mRenderLayout.addRow(tr("Elapsed"), &mElapsedLabel);
    mRenderLayout.addRow(tr("Refresh rate"), &mPeriodLabel);
    mRenderLayout.addRow(tr("Samples written"), &mPeriodWrittenLabel);
    mRenderLayout.setWidget(6, QFormLayout::LabelRole, &mClearButton);
    mRenderGroup.setLayout(&mRenderLayout);

    mButtonLayout.addWidget(&mAutoRefreshCheck);
    mButtonLayout.addWidget(&mIntervalSpin);
    mButtonLayout.addWidget(&mRefreshButton);
    mButtonLayout.addStretch();
    mButtonLayout.addWidget(&mCloseButton);

    mLayout.addWidget(&mRenderGroup, 1);
    mLayout.addLayout(&mButtonLayout);
    mLayout.setSizeConstraint(QLayout::SizeConstraint::SetFixedSize);
    setLayout(&mLayout);

    mIntervalSpin.setSuffix(tr(" ms"));
    mIntervalSpin.setRange(10, 60000);
    mIntervalSpin.setValue(TU::DEFAULT_REFRESH_INTERVAL);

    mAutoRefreshCheck.setCheckState(Qt::Checked);

    mBufferProgress.setAlignment(Qt::AlignCenter);
    mBufferProgress.setFormat(tr("%p% (%v / %m samples)"));

    mCloseButton.setDefault(true);

    setElapsed(0);
    setRunningLabel(false);
    setWindowTitle(tr("Audio diagnostics"));

    connect(&mCloseButton, &QPushButton::clicked, this, &AudioDiagDialog::close);
    connect(&mRefreshButton, &QPushButton::clicked, this, &AudioDiagDialog::refresh);
    connect(&mClearButton, &QPushButton::clicked, &mRenderer, &Renderer::clearDiagnostics);
    connect(&mAutoRefreshCheck, &QCheckBox::stateChanged, this,
        [this](int state) {
            bool checked = state == Qt::Checked;
            mIntervalSpin.setEnabled(checked);
            if (checked) {
                mTimerId = startTimer(mIntervalSpin.value());
            } else {
                killTimer(mTimerId);
            }
        });
    connect(&mIntervalSpin, qOverload<int>(&QSpinBox::valueChanged), this,
        [this](int value) {
            if (mTimerId != -1) {
                killTimer(mTimerId);
                mTimerId = startTimer(value);
            }
        });
    
}